

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

void MatchFinder_Normalize3(UInt32 subValue,CLzRef *items,size_t numItems)

{
  UInt32 value;
  size_t i;
  size_t numItems_local;
  CLzRef *items_local;
  UInt32 subValue_local;
  
  for (i = 0; i < numItems; i = i + 1) {
    if (subValue < items[i]) {
      value = items[i] - subValue;
    }
    else {
      value = 0;
    }
    items[i] = value;
  }
  return;
}

Assistant:

void MatchFinder_Normalize3(UInt32 subValue, CLzRef *items, size_t numItems)
{
  size_t i;
  for (i = 0; i < numItems; i++)
  {
    UInt32 value = items[i];
    if (value <= subValue)
      value = kEmptyHashValue;
    else
      value -= subValue;
    items[i] = value;
  }
}